

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::SkipList
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,KeyComparator *cmp,
          Arena *arena)

{
  Node *pNVar1;
  long lVar2;
  
  (this->compare_).comparator.super_Comparator._vptr_Comparator =
       (_func_int **)&PTR__Comparator_0017d5d0;
  (this->compare_).comparator.user_comparator_ = (cmp->comparator).user_comparator_;
  this->arena_ = arena;
  pNVar1 = (Node *)Arena::AllocateAligned(arena,0x68);
  pNVar1->key = (char *)0x0;
  this->head_ = pNVar1;
  this->max_height_ = (__atomic_base<int>)0x1;
  this->rnd_ = 0x5eadbeef;
  lVar2 = 1;
  do {
    this->head_->next_[lVar2 + -1]._M_b._M_p = (__pointer_type)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xd);
  return;
}

Assistant:

SkipList<Key, Comparator>::SkipList(Comparator cmp, Arena* arena)
    : compare_(cmp),
      arena_(arena),
      head_(NewNode(0 /* any key will do */, kMaxHeight)),
      max_height_(1),
      rnd_(0xdeadbeef) {
  for (int i = 0; i < kMaxHeight; i++) {
    head_->SetNext(i, nullptr);
  }
}